

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O1

void __thiscall fmp4_stream::trun::sample_entry::print(sample_entry *this)

{
  long lVar1;
  ostream *poVar2;
  
  lVar1 = std::cout;
  *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
       *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," sample duration: ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar1 = std::cout;
  *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
       *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," sample size: ",0xe);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

virtual void print() const
			{
				//cout << "trun sample entry: "; 
				std::cout << std::setw(33) << std::left << " sample duration: " << sample_duration_ << std::endl;
				std::cout << std::setw(33) << std::left << " sample size: " << sample_size_ << std::endl;
				//cout << "" << sample_flags << endl;
				//cout << "" << sample_composition_time_offset_v0 <<endl;
				//cout << "" << sample_composition_time_offset_v1 << endl;
			}